

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  size_t sVar1;
  int value_00;
  type tVar2;
  undefined2 *puVar3;
  ulong uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong __maxlen;
  char format [7];
  char local_43;
  undefined1 local_42 [2];
  undefined1 local_40 [4];
  longdouble local_3c;
  
  local_3c = value;
  if (buf->capacity_ <= buf->size_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0x62e,"empty buffer");
  }
  if (((ulong)specs & 0xff00000000) != 0x300000000) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0x62f,"");
  }
  local_43 = '%';
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    puVar3 = (undefined2 *)local_42;
  }
  else {
    puVar3 = (undefined2 *)(local_42 + 1);
    local_42[0] = 0x23;
  }
  if (-1 < precision) {
    *puVar3 = 0x2a2e;
    puVar3 = puVar3 + 1;
  }
  *(undefined1 *)puVar3 = 0x4c;
  *(byte *)((long)puVar3 + 1) = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  *(undefined1 *)(puVar3 + 1) = 0;
  sVar1 = buf->size_;
LAB_0013a42e:
  do {
    __maxlen = buf->capacity_ - sVar1;
    if (precision < 0) {
      value_00 = snprintf(buf->ptr_ + sVar1,__maxlen,&local_43);
    }
    else {
      value_00 = snprintf(buf->ptr_ + sVar1,__maxlen,&local_43,precision,in_R8,in_R9,local_3c);
    }
    if (value_00 < 0) goto LAB_0013a489;
    tVar2 = to_unsigned<int>(value_00);
    uVar4 = (ulong)tVar2;
    if (uVar4 < __maxlen) {
      buffer<char>::try_resize(buf,sVar1 + uVar4);
      return 0;
    }
    uVar4 = uVar4 + sVar1 + 1;
  } while (uVar4 <= buf->capacity_);
  goto LAB_0013a496;
LAB_0013a489:
  if (buf->capacity_ != 0xffffffffffffffff) {
    uVar4 = buf->capacity_ + 1;
LAB_0013a496:
    (**buf->_vptr_buffer)(buf,uVar4);
  }
  goto LAB_0013a42e;
}

Assistant:

auto snprintf_float(T value, int precision, float_specs specs,
                    buffer<char>& buf) -> int {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  FMT_ASSERT(specs.format == float_format::hex, "");
  static_assert(!std::is_same<T, float>::value, "");

  // Build the format string.
  char format[7];  // The longest format is "%#.*Le".
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.upper ? 'A' : 'a';
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
    abort_fuzzing_if(precision > 100000);
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size < capacity) {
      buf.try_resize(size + offset);
      return 0;
    }
    buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
  }
}